

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O1

SymID __thiscall IRBuilder::GetMappedTemp(IRBuilder *this,RegSlot reg)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  uint uVar5;
  
  if (reg < this->firstTemp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.h"
                       ,0xf1,"(this->RegIsTemp(reg))","Processing non-temp reg as a temp?");
    if (!bVar2) goto LAB_004f2a81;
    *puVar4 = 0;
  }
  if (this->tempMap == (SymID *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.h"
                       ,0xf2,"(this->tempMap)","Processing non-temp reg without a temp map?");
    if (!bVar2) goto LAB_004f2a81;
    *puVar4 = 0;
  }
  uVar5 = reg - this->firstTemp;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  RVar3 = JITTimeFunctionBody::GetTempCount(this_00);
  if (RVar3 <= uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.h"
                       ,0xf5,"(tempIndex < m_func->GetJITFunctionBody()->GetTempCount())",
                       "tempIndex < m_func->GetJITFunctionBody()->GetTempCount()");
    if (!bVar2) {
LAB_004f2a81:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return this->tempMap[uVar5];
}

Assistant:

SymID               GetMappedTemp(Js::RegSlot reg)
    {
        AssertMsg(this->RegIsTemp(reg), "Processing non-temp reg as a temp?");
        AssertMsg(this->tempMap, "Processing non-temp reg without a temp map?");

        Js::RegSlot tempIndex = reg - this->firstTemp;
        AssertOrFailFast(tempIndex < m_func->GetJITFunctionBody()->GetTempCount());
        return this->tempMap[tempIndex];
    }